

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcEmbedBuilderDbl::add_segment(CTcEmbedBuilderDbl *this,CTcPrsNode *cur)

{
  size_t len;
  CTPNDstr *this_00;
  CTcPrsNode *pCVar1;
  char *str;
  
  len = (G_tok->curtok_).text_len_;
  pCVar1 = cur;
  if (len != 0) {
    this_00 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)cur);
    str = (G_tok->curtok_).text_;
    CTPNDstr::CTPNDstr(this_00,str,len);
    pCVar1 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)str);
    pCVar1[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)cur;
    pCVar1[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)this_00;
    (pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00351300;
  }
  return pCVar1;
}

Assistant:

virtual CTcPrsNode *add_segment(CTcPrsNode *cur)
    {
        /*
         *   Combine the part so far with the next string segment, using a
         *   comma operator.  If the next string segment is empty, there's no
         *   need to add anything for it.  
         */
        size_t len = G_tok->getcur()->get_text_len();
        if (len != 0)
        {
            /* create a node for the new string segment */
            CTcPrsNode *newstr = new CTPNDstr(
                G_tok->getcur()->get_text(), len);
            
            /* combine it into the part so far with a comma operator */
            cur = new CTPNComma(cur, newstr);
        }

        /* return the new combined node */
        return cur;
    }